

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CArena.cpp
# Opt level: O1

size_t __thiscall amrex::CArena::sizeOf(CArena *this,void *p)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  
  if (p != (void *)0x0) {
    uVar1 = (this->m_busylist)._M_h._M_bucket_count;
    uVar3 = (ulong)p % uVar1;
    p_Var4 = (this->m_busylist)._M_h._M_buckets[uVar3];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, p_Var4->_M_nxt[1]._M_nxt != (_Hash_node_base *)p))
    {
      while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
           (p_Var5 = p_Var4, p_Var2[1]._M_nxt == (_Hash_node_base *)p)) goto LAB_00558619;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_00558619:
    if (p_Var5 == (__node_base_ptr)0x0) {
      p_Var2 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var2 = p_Var5->_M_nxt;
    }
    if (p_Var2 != (_Hash_node_base *)0x0) {
      return (size_t)p_Var2[3]._M_nxt;
    }
  }
  return 0;
}

Assistant:

std::size_t
CArena::sizeOf (void* p) const noexcept
{
    if (p == nullptr) {
        return 0;
    } else {
        auto it = m_busylist.find(Node(p,0,0));
        if (it == m_busylist.end()) {
            return 0;
        } else {
            return it->size();
        }
    }
}